

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void getFloat(char *attrName,int argc,char **argv,int *i,int part,SetAttrVector *attrs,
             _func_void_char_ptr_float *check)

{
  invalid_argument *this;
  vector<SetAttr,_std::allocator<SetAttr>_> *this_00;
  int *in_RCX;
  long in_RDX;
  int in_ESI;
  SetAttr *in_RDI;
  undefined4 in_R8D;
  string *in_R9;
  double dVar1;
  code *in_stack_00000008;
  float f;
  undefined4 in_stack_ffffffffffffff38;
  allocator<char> local_91;
  allocator<char> *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  
  if (in_ESI + -2 < *in_RCX) {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"Expected a float");
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  dVar1 = strtod(*(char **)(in_RDX + (long)(*in_RCX + 1) * 8),(char **)0x0);
  if (in_stack_00000008 != (code *)0x0) {
    (*in_stack_00000008)((float)dVar1,in_RDI);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  this_00 = (vector<SetAttr,_std::allocator<SetAttr>_> *)operator_new(0x10);
  Imf_3_2::TypedAttribute<float>::TypedAttribute((float *)this_00);
  SetAttr::SetAttr(in_RDI,in_R9,(int)((ulong)this_00 >> 0x20),
                   (Attribute *)CONCAT44(in_R8D,in_stack_ffffffffffffff38));
  std::vector<SetAttr,_std::allocator<SetAttr>_>::push_back
            (this_00,(value_type *)CONCAT44(in_R8D,in_stack_ffffffffffffff38));
  SetAttr::~SetAttr((SetAttr *)0x1051c0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
  std::allocator<char>::~allocator(&local_91);
  *in_RCX = *in_RCX + 2;
  return;
}

Assistant:

void
getFloat (
    const char     attrName[],
    int            argc,
    char**         argv,
    int&           i,
    int            part,
    SetAttrVector& attrs,
    void (*check) (const char attrName[], float f) = 0)
{
    if (i > argc - 2)
        throw invalid_argument("Expected a float");

    float f = static_cast<float> (strtod (argv[i + 1], 0));

    if (check) check (attrName, f);

    attrs.push_back (SetAttr (attrName, part, new FloatAttribute (f)));
    i += 2;
}